

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::(anonymous_namespace)::TryConvertFacevaryingToVertexFloat<double,double>
               (vector<double,_std::allocator<double>_> *src,
               vector<double,_std::allocator<double>_> *dst,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,double eps)

{
  double dVar1;
  value_type vVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  const_reference pvVar7;
  uint *puVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  const_reference pvVar11;
  double *__s;
  reference ppVar12;
  reference pvVar13;
  pair<const_unsigned_int,_double> *v;
  iterator __end0;
  iterator __begin0;
  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  *__range3;
  ulong uStack_78;
  uint32_t vidx;
  size_t i;
  undefined1 local_68 [4];
  uint32_t max_vidx;
  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  vdata;
  double eps_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<double,_std::allocator<double>_> *dst_local;
  vector<double,_std::allocator<double>_> *src_local;
  
  if (dst == (vector<double,_std::allocator<double>_> *)0x0) {
    src_local._7_1_ = false;
  }
  else {
    vdata._M_h._M_single_bucket = (__node_base_ptr)eps;
    sVar5 = ::std::vector<double,_std::allocator<double>_>::size(src);
    sVar6 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(faceVertexIndices);
    if (sVar5 == sVar6) {
      sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(faceVertexIndices);
      if (sVar5 < 3) {
        src_local._7_1_ = false;
      }
      else {
        ::std::
        unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
        ::unordered_map((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                         *)local_68);
        i._4_4_ = 0;
        for (uStack_78 = 0; uVar3 = uStack_78,
            sVar5 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              (faceVertexIndices), uVar3 < sVar5; uStack_78 = uStack_78 + 1) {
          pvVar7 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (faceVertexIndices,uStack_78);
          __range3._4_4_ = *pvVar7;
          puVar8 = ::std::max<unsigned_int>((uint *)((long)&__range3 + 4),(uint *)((long)&i + 4));
          i._4_4_ = *puVar8;
          sVar9 = ::std::
                  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                  ::count((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                           *)local_68,(key_type *)((long)&__range3 + 4));
          if (sVar9 == 0) {
            pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[](src,uStack_78);
            vVar2 = *pvVar11;
            pmVar10 = ::std::
                      unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                      ::operator[]((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                                    *)local_68,(key_type *)((long)&__range3 + 4));
            *pmVar10 = vVar2;
          }
          else {
            pmVar10 = ::std::
                      unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                      ::operator[]((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                                    *)local_68,(key_type *)((long)&__range3 + 4));
            dVar1 = *pmVar10;
            pvVar11 = ::std::vector<double,_std::allocator<double>_>::operator[](src,uStack_78);
            bVar4 = math::is_close(dVar1,*pvVar11,(double)vdata._M_h._M_single_bucket);
            if (!bVar4) {
              src_local._7_1_ = false;
              goto LAB_00501307;
            }
          }
        }
        ::std::vector<double,_std::allocator<double>_>::resize(dst,(ulong)(i._4_4_ + 1));
        __s = ::std::vector<double,_std::allocator<double>_>::data(dst);
        memset(__s,0,(ulong)(i._4_4_ + 1) << 3);
        __end0 = ::std::
                 unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                 ::begin((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                          *)local_68);
        v = (pair<const_unsigned_int,_double> *)
            ::std::
            unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
            ::end((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                   *)local_68);
        while (bVar4 = ::std::__detail::operator!=
                                 (&__end0.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_double>,_false>
                                    *)&v), bVar4) {
          ppVar12 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_double>,_false,_false>::operator*
                              (&__end0);
          dVar1 = ppVar12->second;
          pvVar13 = ::std::vector<double,_std::allocator<double>_>::operator[]
                              (dst,(ulong)ppVar12->first);
          *pvVar13 = dVar1;
          ::std::__detail::_Node_iterator<std::pair<const_unsigned_int,_double>,_false,_false>::
          operator++(&__end0);
        }
        src_local._7_1_ = true;
LAB_00501307:
        __range3._0_4_ = 1;
        ::std::
        unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                          *)local_68);
      }
    }
    else {
      src_local._7_1_ = false;
    }
  }
  return src_local._7_1_;
}

Assistant:

bool TryConvertFacevaryingToVertexFloat(
    const std::vector<T> &src, std::vector<T> *dst,
    const std::vector<uint32_t> &faceVertexIndices, const EpsTy eps) {
  DCOUT("TryConvertFacevaryingToVertexFloat");
  if (!dst) {
    return false;
  }

  if (src.size() != faceVertexIndices.size()) {
    DCOUT("size mismatch.");
    return false;
  }

  // size must be at least 1 triangle(3 verts).
  if (faceVertexIndices.size() < 3) {
    return false;
  }

  // vidx, value
  std::unordered_map<uint32_t, T> vdata;

  uint32_t max_vidx = 0;
  for (size_t i = 0; i < faceVertexIndices.size(); i++) {
    uint32_t vidx = faceVertexIndices[i];
    max_vidx = (std::max)(vidx, max_vidx);

    if (vdata.count(vidx)) {
      if (!math::is_close(vdata[vidx], src[i], eps)) {
        DCOUT("diff at faceVertexIndices[" << i << "]");
        return false;
      }
    } else {
      vdata[vidx] = src[i];
    }
  }

  dst->resize(max_vidx + 1);
  memset(dst->data(), 0, (max_vidx + 1) * sizeof(T));

  for (const auto &v : vdata) {
    (*dst)[v.first] = v.second;
  }

  return true;
}